

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress.c
# Opt level: O0

void Abc_NtkDress(Abc_Ntk_t *pNtkLogic,char *pFileName,int fVerbose)

{
  int iVar1;
  Io_FileType_t FileType;
  uint uVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pNtk1;
  stmm_table *tMapping_00;
  stmm_table *tMapping;
  Abc_Ntk_t *pMiterFraig;
  Abc_Ntk_t *pMiter;
  Abc_Ntk_t *pNtkLogicOrig;
  Abc_Ntk_t *pNtkOrig;
  int fVerbose_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtkLogic_local;
  
  iVar1 = Abc_NtkIsLogic(pNtkLogic);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtkLogic)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                  ,0x39,"void Abc_NtkDress(Abc_Ntk_t *, char *, int)");
  }
  FileType = Io_ReadFileType(pFileName);
  pNtk = Io_ReadNetlist(pFileName,FileType,1);
  if (pNtk != (Abc_Ntk_t *)0x0) {
    iVar1 = Abc_NtkIsNetlist(pNtk);
    if (iVar1 == 0) {
      __assert_fail("Abc_NtkIsNetlist(pNtkOrig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDress.c"
                    ,0x3f,"void Abc_NtkDress(Abc_Ntk_t *, char *, int)");
    }
    Abc_NtkCleanCopy(pNtkLogic);
    Abc_NtkCleanCopy(pNtk);
    pAVar4 = Abc_NtkToLogic(pNtk);
    iVar1 = Abc_NtkCompareSignals(pNtkLogic,pAVar4,1,1);
    if (iVar1 == 0) {
      Abc_NtkDelete(pNtk);
      Abc_NtkDelete(pAVar4);
    }
    else {
      pNtk1 = Abc_NtkStrash(pNtkLogic,1,0,0);
      Abc_NtkAppend(pNtk1,pAVar4,1);
      Abc_NtkTransferCopy(pNtk);
      Abc_NtkDelete(pAVar4);
      if (fVerbose != 0) {
        printf("After mitering:\n");
        uVar2 = Abc_NtkNodeNum(pNtkLogic);
        uVar3 = Abc_NtkCountCopy(pNtkLogic);
        printf("Logic:  Nodes = %5d. Copy = %5d. \n",(ulong)uVar2,(ulong)uVar3);
        uVar2 = Abc_NtkNodeNum(pNtk);
        uVar3 = Abc_NtkCountCopy(pNtk);
        printf("Orig:   Nodes = %5d. Copy = %5d. \n",(ulong)uVar2,(ulong)uVar3);
      }
      pAVar4 = Abc_NtkIvyFraig(pNtk1,100,1,0,1,0);
      Abc_NtkTransferCopy(pNtkLogic);
      Abc_NtkTransferCopy(pNtk);
      Abc_NtkDelete(pNtk1);
      if (fVerbose != 0) {
        printf("After fraiging:\n");
        uVar2 = Abc_NtkNodeNum(pNtkLogic);
        uVar3 = Abc_NtkCountCopy(pNtkLogic);
        printf("Logic:  Nodes = %5d. Copy = %5d. \n",(ulong)uVar2,(ulong)uVar3);
        uVar2 = Abc_NtkNodeNum(pNtk);
        uVar3 = Abc_NtkCountCopy(pNtk);
        printf("Orig:   Nodes = %5d. Copy = %5d. \n",(ulong)uVar2,(ulong)uVar3);
      }
      tMapping_00 = Abc_NtkDressDeriveMapping(pNtk);
      Abc_NtkDressTransferNames(pNtkLogic,tMapping_00,fVerbose);
      stmm_free_table(tMapping_00);
      Abc_NtkDelete(pAVar4);
      Abc_NtkDelete(pNtk);
    }
  }
  return;
}

Assistant:

void Abc_NtkDress( Abc_Ntk_t * pNtkLogic, char * pFileName, int fVerbose )
{
    Abc_Ntk_t * pNtkOrig, * pNtkLogicOrig;
    Abc_Ntk_t * pMiter, * pMiterFraig;
    stmm_table * tMapping;

    assert( Abc_NtkIsLogic(pNtkLogic) );

    // get the original netlist
    pNtkOrig = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), 1 );
    if ( pNtkOrig == NULL )
        return;
    assert( Abc_NtkIsNetlist(pNtkOrig) );

    Abc_NtkCleanCopy(pNtkLogic);
    Abc_NtkCleanCopy(pNtkOrig);

    // convert it into the logic network
    pNtkLogicOrig = Abc_NtkToLogic( pNtkOrig );
    // check that the networks have the same PIs/POs/latches
    if ( !Abc_NtkCompareSignals( pNtkLogic, pNtkLogicOrig, 1, 1 ) )
    {
        Abc_NtkDelete( pNtkOrig );
        Abc_NtkDelete( pNtkLogicOrig );
        return;
    }

    // convert the current logic network into an AIG
    pMiter = Abc_NtkStrash( pNtkLogic, 1, 0, 0 );

    // convert it into the AIG and make the netlist point to the AIG
    Abc_NtkAppend( pMiter, pNtkLogicOrig, 1 );
    Abc_NtkTransferCopy( pNtkOrig );
    Abc_NtkDelete( pNtkLogicOrig );

if ( fVerbose ) 
{
printf( "After mitering:\n" );
printf( "Logic:  Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkLogic), Abc_NtkCountCopy(pNtkLogic) );
printf( "Orig:   Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkOrig),  Abc_NtkCountCopy(pNtkOrig) );
}

    // fraig the miter (miter nodes point to the fraiged miter)
    pMiterFraig = Abc_NtkIvyFraig( pMiter, 100, 1, 0, 1, 0 );
    // make netlists point to the fraiged miter
    Abc_NtkTransferCopy( pNtkLogic );
    Abc_NtkTransferCopy( pNtkOrig );
    Abc_NtkDelete( pMiter );

if ( fVerbose ) 
{
printf( "After fraiging:\n" );
printf( "Logic:  Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkLogic), Abc_NtkCountCopy(pNtkLogic) );
printf( "Orig:   Nodes = %5d. Copy = %5d. \n", Abc_NtkNodeNum(pNtkOrig),  Abc_NtkCountCopy(pNtkOrig) );
}

    // derive mapping from the fraiged nodes into their prototype nodes in the original netlist
    tMapping = Abc_NtkDressDeriveMapping( pNtkOrig );

    // transfer the names to the new netlist
    Abc_NtkDressTransferNames( pNtkLogic, tMapping, fVerbose );

    // clean up
    stmm_free_table( tMapping );
    Abc_NtkDelete( pMiterFraig );
    Abc_NtkDelete( pNtkOrig );
}